

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::doTraverseSchema(TraverseSchema *this,DOMElement *schemaRoot)

{
  XMLSize_t XVar1;
  SchemaElementDecl *elemDecl;
  XMLSize_t XVar2;
  bool bVar3;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar4;
  SchemaElementDecl **ppSVar5;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *this_00;
  DOMElement **ppDVar6;
  XMLSize_t j;
  XMLSize_t getAt;
  XMLSize_t i;
  XMLSize_t getAt_00;
  
  processChildren(this,schemaRoot);
  if (this->fIC_ElementsNS !=
      (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
       *)0x0) {
    bVar3 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
            ::containsKey(this->fIC_ElementsNS,this->fTargetNSURIString);
    if (bVar3) {
      pVVar4 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(this->fIC_ElementsNS,this->fTargetNSURIString);
      this->fIC_Elements = pVVar4;
      XVar1 = pVVar4->fCurCount;
      for (getAt_00 = 0; getAt_00 != XVar1; getAt_00 = getAt_00 + 1) {
        ppSVar5 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt
                            (this->fIC_Elements,getAt_00);
        elemDecl = *ppSVar5;
        this_00 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
                  ::get(this->fIC_NodeListNS,elemDecl);
        XVar2 = this_00->fCurCount;
        for (getAt = 0; XVar2 != getAt; getAt = getAt + 1) {
          ppDVar6 = ValueVectorOf<xercesc_4_0::DOMElement_*>::elementAt(this_00,getAt);
          traverseKeyRef(this,*ppDVar6,elemDecl);
        }
      }
    }
  }
  if ((this->fScanner->fValidateAnnotations == true) &&
     (this->fSchemaGrammar->fAnnotations->fCount != 0)) {
    validateAnnotations(this);
  }
  this->fSchemaInfo->fProcessed = true;
  return;
}

Assistant:

void TraverseSchema::doTraverseSchema(const DOMElement* const schemaRoot) {

    // process children nodes
    processChildren(schemaRoot);

    // Handle identity constraints - keyref
    if (fIC_ElementsNS && fIC_ElementsNS->containsKey(fTargetNSURIString)) {

        fIC_Elements = fIC_ElementsNS->get(fTargetNSURIString);

        XMLSize_t icListSize = fIC_Elements->size();

        for (XMLSize_t i=0; i < icListSize; i++) {

            SchemaElementDecl* curElem = fIC_Elements->elementAt(i);
            ValueVectorOf<DOMElement*>* icNodes =  fIC_NodeListNS->get(curElem);
            XMLSize_t icNodesSize = icNodes->size();

            for (XMLSize_t j = 0; j < icNodesSize; j++) {
                traverseKeyRef(icNodes->elementAt(j), curElem);
            }
        }
    }

    if (fScanner->getValidateAnnotations() && !fSchemaGrammar->getAnnotations()->isEmpty())
    {
        validateAnnotations();
    }
    fSchemaInfo->setProcessed();
}